

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

int read_header(archive_read *a,archive_entry *entry,char head_type)

{
  undefined4 *puVar1;
  undefined1 uVar2;
  byte bVar3;
  short sVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  void *pvVar8;
  long lVar9;
  archive_entry *paVar10;
  uint uVar11;
  int iVar12;
  wchar_t wVar13;
  uchar *p;
  archive_string_conv *paVar14;
  short *psVar15;
  uLong uVar16;
  uint *buf;
  time_t tVar17;
  void *pvVar18;
  size_t sVar19;
  ulong *puVar20;
  short *psVar21;
  int *piVar22;
  tm *__tp;
  byte bVar23;
  long lVar24;
  long *plVar25;
  undefined7 in_register_00000011;
  char *pcVar26;
  ushort *puVar27;
  ushort *puVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  byte bVar32;
  ulong uVar33;
  char cVar34;
  undefined1 uVar35;
  int iVar36;
  ulong uVar37;
  ushort *puVar38;
  uint uVar39;
  void *pvVar40;
  bool bVar41;
  ushort *local_c8;
  time_t local_b0;
  uint local_a4;
  archive_string_conv *local_a0;
  ulong local_98;
  void *local_90;
  archive_entry *local_88;
  uint local_7c;
  archive_string_conv *local_78;
  ulong *local_70;
  long *local_68;
  ulong *local_60;
  long *local_58;
  ulong *local_50;
  long *local_48;
  ulong *local_40;
  ulong local_38;
  
  pvVar8 = a->format->data;
  paVar14 = *(archive_string_conv **)((long)pvVar8 + 0x4ed8);
  if (paVar14 == (archive_string_conv *)0x0) {
    if (*(int *)((long)pvVar8 + 0x4ec8) == 0) {
      paVar14 = archive_string_default_conversion_for_read(&a->archive);
      *(archive_string_conv **)((long)pvVar8 + 0x4ed0) = paVar14;
      *(undefined4 *)((long)pvVar8 + 0x4ec8) = 1;
    }
    else {
      paVar14 = *(archive_string_conv **)((long)pvVar8 + 0x4ed0);
    }
  }
  psVar15 = (short *)__archive_read_ahead(a,7,(ssize_t *)0x0);
  if (psVar15 == (short *)0x0) {
    return -0x1e;
  }
  local_90 = (void *)CONCAT44(local_90._4_4_,(int)CONCAT71(in_register_00000011,head_type));
  sVar4 = *psVar15;
  uVar30 = (ulong)*(ushort *)((long)psVar15 + 5);
  *(uint *)((long)pvVar8 + 0x18) = (uint)*(ushort *)((long)psVar15 + 3);
  if (uVar30 < 0x20) {
LAB_00158e98:
    pcVar26 = "Invalid header size";
  }
  else {
    local_88 = entry;
    uVar16 = cm_zlib_crc32(0,(uchar *)(psVar15 + 1),5);
    __archive_read_consume(a,7);
    if ((*(byte *)((long)pvVar8 + 0x18) & 0x10) == 0) {
      *(undefined1 *)((long)pvVar8 + 0x17) = 0;
      *(undefined4 *)((long)pvVar8 + 0x40) = 0;
      *(undefined1 (*) [16])((long)pvVar8 + 0x20) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)pvVar8 + 0x30) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)pvVar8 + 0x68) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)pvVar8 + 0x78) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)pvVar8 + 0x88) = (undefined1  [16])0x0;
      *(undefined8 *)((long)pvVar8 + 0x98) = 0;
      local_78 = paVar14;
      buf = (uint *)__archive_read_ahead(a,uVar30 - 7,(ssize_t *)0x0);
      if (buf == (uint *)0x0) {
        return -0x1e;
      }
      uVar16 = cm_zlib_crc32(uVar16,(uchar *)buf,(uint)(uVar30 - 7));
      if (sVar4 == (short)uVar16) {
        uVar29 = *buf;
        uVar37 = (ulong)uVar29;
        uVar39 = buf[1];
        local_38 = (ulong)(byte)buf[2];
        uVar11 = *(uint *)((long)buf + 9);
        iVar12 = *(int *)((long)buf + 0xd);
        uVar5 = *(ushort *)((long)buf + 0x13);
        uVar33 = (ulong)uVar5;
        uVar6 = *(uint *)((long)buf + 0x15);
        *(undefined1 *)((long)pvVar8 + 0x17) = *(undefined1 *)((long)buf + 0x12);
        tVar17 = get_time(iVar12);
        *(time_t *)((long)pvVar8 + 0x30) = tVar17;
        *(ulong *)((long)pvVar8 + 8) = (ulong)uVar11;
        uVar11 = *(uint *)((long)pvVar8 + 0x18);
        if ((uVar11 & 4) != 0) {
          archive_entry_set_is_data_encrypted(local_88,'\x01');
          *(undefined4 *)((long)pvVar8 + 0x4f10) = 1;
          archive_set_error(&a->archive,0x54,"RAR encryption support unavailable.");
          uVar11 = *(uint *)((long)pvVar8 + 0x18);
        }
        if ((uVar11 >> 8 & 1) == 0) {
          pvVar40 = (void *)((long)buf + 0x19);
          *(ulong *)((long)pvVar8 + 0x20) = uVar37;
          *(ulong *)((long)pvVar8 + 0x28) = (ulong)uVar39;
        }
        else {
          uVar11 = *(uint *)((long)buf + 0x19);
          uVar7 = *(uint *)((long)buf + 0x1d);
          uVar37 = CONCAT44(uVar11,uVar29);
          *(ulong *)((long)pvVar8 + 0x20) = uVar37;
          *(ulong *)((long)pvVar8 + 0x28) = CONCAT44(uVar7,uVar39);
          if ((long)((ulong)(uVar7 | uVar11) << 0x20) < 0) {
            pcVar26 = "Invalid sizes specified.";
            goto LAB_001590b4;
          }
          pvVar40 = (void *)((long)buf + 0x21);
        }
        *(ulong *)((long)pvVar8 + 0xa8) = uVar37;
        local_a4 = uVar6;
        if ((char)local_90 == 'z') {
          pvVar18 = __archive_read_ahead(a,(uVar37 + uVar30) - 7,(ssize_t *)0x0);
          if (pvVar18 == (void *)0x0) {
            return -0x1e;
          }
          uVar30 = uVar30 + uVar37;
          lVar24 = (long)pvVar18 + uVar30;
          pvVar40 = (void *)(((long)pvVar40 - (long)buf) + (long)pvVar18);
        }
        else {
          lVar24 = (long)buf + uVar30;
        }
        puVar27 = (ushort *)(lVar24 + -7);
        local_c8 = (ushort *)((long)pvVar40 + uVar33);
        if (puVar27 < local_c8) {
          pcVar26 = "Invalid filename size";
          goto LAB_001590b4;
        }
        psVar15 = *(short **)((long)pvVar8 + 0x48);
        uVar29 = (uint)uVar5 * 2;
        uVar37 = (ulong)uVar29 + 2;
        if (uVar37 <= *(ulong *)((long)pvVar8 + 0x60)) {
LAB_00159112:
          memcpy(psVar15,pvVar40,uVar33);
          *(undefined1 *)((long)psVar15 + uVar33) = 0;
          if ((*(byte *)((long)pvVar8 + 0x19) & 2) == 0) {
            while (pcVar26 = strchr((char *)psVar15,0x5c), pcVar26 != (char *)0x0) {
              *pcVar26 = '/';
            }
            local_a0 = local_78;
          }
          else {
            sVar19 = strlen((char *)psVar15);
            if (sVar19 != uVar33) {
              uVar11 = (int)sVar19 + 2;
              uVar2 = *(undefined1 *)((long)pvVar40 + (ulong)((int)sVar19 + 1));
              local_98 = (long)psVar15 + 1;
              uVar39 = 0;
              bVar23 = 0;
              bVar32 = 0;
LAB_001591df:
              uVar33 = (ulong)(int)uVar39;
              uVar37 = (ulong)uVar39;
              uVar31 = (ulong)uVar11;
              if ((uVar5 <= uVar11) || (uVar29 <= uVar39)) goto LAB_001592df;
              if (bVar23 == 0) {
                uVar11 = uVar11 + 1;
                bVar32 = *(byte *)((long)pvVar40 + uVar31);
                bVar23 = 8;
              }
              bVar23 = bVar23 - 2;
              uVar31 = (ulong)uVar11;
              switch(bVar32 >> (bVar23 & 0x1f) & 3) {
              case 0:
                *(undefined1 *)((long)psVar15 + uVar37) = 0;
                break;
              case 1:
                *(undefined1 *)((long)psVar15 + uVar37) = uVar2;
                break;
              case 2:
                *(undefined1 *)((long)psVar15 + uVar37) =
                     *(undefined1 *)((long)pvVar40 + uVar31 + 1);
                uVar39 = uVar39 + 2;
                *(undefined1 *)((long)psVar15 + uVar33 + 1) =
                     *(undefined1 *)((long)pvVar40 + uVar31);
                uVar11 = uVar11 + 2;
                goto LAB_001591df;
              case 3:
                goto switchD_00159222_caseD_3;
              }
              uVar11 = uVar11 + 1;
              uVar39 = uVar39 + 2;
              *(undefined1 *)((long)psVar15 + uVar33 + 1) = *(undefined1 *)((long)pvVar40 + uVar31);
              goto LAB_001591df;
            }
            local_a0 = *(archive_string_conv **)((long)pvVar8 + 0x4ee0);
            if (local_a0 == (archive_string_conv *)0x0) {
              local_a0 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
              *(archive_string_conv **)((long)pvVar8 + 0x4ee0) = local_a0;
              if (local_a0 == (archive_string_conv *)0x0) {
                return -0x1e;
              }
            }
            while (pcVar26 = strchr((char *)psVar15,0x5c), pcVar26 != (char *)0x0) {
              *pcVar26 = '/';
            }
          }
          uVar39 = (uint)uVar5;
          goto LAB_0015930b;
        }
        psVar15 = (short *)realloc(psVar15,uVar37);
        if (psVar15 != (short *)0x0) {
          *(short **)((long)pvVar8 + 0x48) = psVar15;
          *(ulong *)((long)pvVar8 + 0x60) = uVar37;
          goto LAB_00159112;
        }
        pcVar26 = "Couldn\'t allocate memory.";
LAB_001592fb:
        iVar12 = 0xc;
LAB_001590b6:
        archive_set_error(&a->archive,iVar12,pcVar26);
        return -0x1e;
      }
      pcVar26 = "Header CRC error";
    }
    else {
      pcVar26 = "RAR solid archive support unavailable.";
    }
  }
  iVar12 = 0x54;
LAB_00158ff8:
  archive_set_error(&a->archive,iVar12,pcVar26);
  return -0x1e;
LAB_001592df:
  if (uVar29 < uVar39) {
    pcVar26 = "Invalid filename";
LAB_001590b4:
    iVar12 = 0x54;
    goto LAB_001590b6;
  }
  *(undefined1 *)((long)psVar15 + uVar37) = 0;
  *(undefined1 *)((long)psVar15 + uVar33 + 1) = 0;
  local_a0 = *(archive_string_conv **)((long)pvVar8 + 0x4ee8);
  if (local_a0 == (archive_string_conv *)0x0) {
    local_a0 = archive_string_conversion_from_charset(&a->archive,"UTF-16BE",L'\x01');
    *(archive_string_conv **)((long)pvVar8 + 0x4ee8) = local_a0;
    if (local_a0 == (archive_string_conv *)0x0) {
      return -0x1e;
    }
  }
  uVar39 = uVar39 + 2;
  for (psVar21 = psVar15; *psVar21 != 0; psVar21 = psVar21 + 1) {
    if (*psVar21 == 0x5c00) {
      *(undefined1 *)((long)psVar21 + 1) = 0x2f;
    }
  }
  local_c8 = (ushort *)((long)pvVar40 + uVar31);
LAB_0015930b:
  pvVar40 = *(void **)((long)pvVar8 + 0x50);
  uVar33 = (ulong)uVar39;
  if (((pvVar40 == (void *)0x0) || (*(ulong *)((long)pvVar8 + 0x58) != uVar33)) ||
     (iVar12 = bcmp(*(void **)((long)pvVar8 + 0x48),pvVar40,(ulong)(uVar39 + 1)), iVar12 != 0)) {
    pvVar40 = realloc(pvVar40,(ulong)(uVar39 + 1));
    *(void **)((long)pvVar8 + 0x50) = pvVar40;
    memcpy(pvVar40,*(void **)((long)pvVar8 + 0x48),(ulong)(uVar39 + 1));
    *(ulong *)((long)pvVar8 + 0x58) = uVar33;
    free(*(void **)((long)pvVar8 + 0x100));
    puVar20 = (ulong *)calloc(1,0x18);
    *(ulong **)((long)pvVar8 + 0x100) = puVar20;
    if (puVar20 != (ulong *)0x0) {
      *puVar20 = uVar30;
      *(undefined4 *)(puVar20 + 1) = 0xffffffff;
      *(undefined4 *)((long)puVar20 + 0xc) = 0xffffffff;
      *(undefined4 *)(puVar20 + 2) = 0xffffffff;
      *(undefined4 *)((long)puVar20 + 0x14) = 0xffffffff;
      *(undefined8 *)((long)pvVar8 + 0x108) = 0x100000000;
      if ((*(uint *)((long)pvVar8 + 0x18) >> 10 & 1) != 0) {
        if (puVar27 < local_c8 + 4) goto LAB_00158e98;
        *(undefined8 *)((long)pvVar8 + 0x68) = *(undefined8 *)local_c8;
        local_c8 = local_c8 + 4;
      }
      if ((*(uint *)((long)pvVar8 + 0x18) >> 0xc & 1) != 0) {
        puVar28 = local_c8 + 1;
        local_98 = uVar33;
        if (puVar27 < puVar28) {
LAB_00159453:
          pcVar26 = "Invalid header size";
          goto LAB_001590b4;
        }
        local_48 = (long *)((long)pvVar8 + 0x80);
        local_58 = (long *)((long)pvVar8 + 0x70);
        local_68 = (long *)((long)pvVar8 + 0x90);
        local_60 = (ulong *)((long)pvVar8 + 0x78);
        local_50 = (ulong *)((long)pvVar8 + 0x88);
        local_40 = (ulong *)((long)pvVar8 + 0x38);
        local_70 = (ulong *)((long)pvVar8 + 0x98);
        uVar29 = (uint)*local_c8;
        local_7c = (uint)*local_c8;
        for (iVar12 = 3; -1 < iVar12; iVar12 = iVar12 + -1) {
          local_b0 = 0;
          bVar41 = true;
          if (iVar12 == 3) {
            local_b0 = *(long *)((long)pvVar8 + 0x30);
            bVar41 = local_b0 == 0;
          }
          uVar39 = uVar29 >> ((char)iVar12 * '\x04' & 0x1fU);
          if ((uVar39 & 8) != 0) {
            puVar38 = puVar28;
            if (bVar41) {
              if (puVar27 < puVar28 + 2) goto LAB_00159453;
              local_b0 = get_time(*(int *)puVar28);
              puVar38 = puVar28 + 2;
            }
            puVar28 = (ushort *)((long)puVar38 + (ulong)(uVar39 & 3));
            if (puVar27 < puVar28) goto LAB_00159453;
            uVar29 = 0;
            for (lVar24 = 0; (uVar39 & 3) != (uint)lVar24; lVar24 = lVar24 + 1) {
              uVar29 = uVar29 >> 8 | (int)*(char *)((long)puVar38 + lVar24) << 0x10;
            }
            __tp = localtime(&local_b0);
            iVar36 = __tp->tm_sec;
            if ((uVar39 & 4) != 0) {
              __tp->tm_sec = iVar36 + 1;
              local_b0 = mktime(__tp);
            }
            plVar25 = (long *)((long)pvVar8 + 0x30);
            puVar20 = local_40;
            if (((iVar12 != 3) && (plVar25 = local_48, puVar20 = local_50, iVar12 != 2)) &&
               (plVar25 = local_58, puVar20 = local_60, iVar12 != 1)) {
              plVar25 = local_68;
              puVar20 = local_70;
            }
            *plVar25 = local_b0;
            *puVar20 = (ulong)(iVar36 + uVar29 / 10000000);
            uVar33 = local_98;
            uVar29 = local_7c;
          }
        }
      }
      __archive_read_consume(a,uVar30 - 7);
      lVar24 = a->filter->position;
      lVar9 = *(long *)((long)pvVar8 + 0x100);
      *(long *)(lVar9 + 8) = lVar24;
      *(long *)(lVar9 + 0x10) = lVar24 + *(long *)((long)pvVar8 + 0x20);
      uVar29 = local_a4;
      if (2 < (uint)local_38 - 3) {
        if (2 < (uint)local_38) {
          pcVar26 = "Unknown file attributes from RAR file\'s host OS";
          iVar12 = 0x54;
          goto LAB_001598c8;
        }
        uVar29 = 0x41ed;
        if ((local_a4 & 0x10) == 0) {
          uVar29 = 0x81a4;
        }
      }
      *(uint *)((long)pvVar8 + 0x40) = uVar29;
      *(undefined8 *)((long)pvVar8 + 0xa0) = 0;
      *(undefined8 *)((long)pvVar8 + 0x358) = 0;
      *(undefined4 *)((long)pvVar8 + 0xe8) = 0;
      *(undefined4 *)((long)pvVar8 + 0x4ef8) = 0;
      *(undefined8 *)((long)pvVar8 + 0x4f00) = 0;
      *(undefined8 *)((long)pvVar8 + 0xf0) = 0;
      *(undefined1 *)((long)pvVar8 + 0xed) = 0;
      *(undefined1 (*) [16])((long)pvVar8 + 0xb0) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)pvVar8 + 0xc0) = (undefined1  [16])0x0;
      *(undefined1 *)((long)pvVar8 + 0xd0) = 1;
      *(undefined1 *)((long)pvVar8 + 0x393) = 0;
      *(undefined1 *)((long)pvVar8 + 0x390) = 1;
      free(*(void **)((long)pvVar8 + 0xe0));
      *(undefined8 *)((long)pvVar8 + 0xe0) = 0;
      *(undefined8 *)((long)pvVar8 + 0xd4) = 0x2000000000000;
      memset((void *)((long)pvVar8 + 0x1b0),0,0x194);
      Ppmd7_Free((CPpmd7 *)((long)pvVar8 + 0x398),&g_szalloc);
      paVar10 = local_88;
      *(undefined2 *)((long)pvVar8 + 0x391) = 0;
      if ((char)local_90 == 'z') {
        return 0;
      }
      archive_entry_set_mtime
                (local_88,*(time_t *)((long)pvVar8 + 0x30),*(long *)((long)pvVar8 + 0x38));
      archive_entry_set_ctime
                (paVar10,*(time_t *)((long)pvVar8 + 0x80),*(long *)((long)pvVar8 + 0x88));
      archive_entry_set_atime
                (paVar10,*(time_t *)((long)pvVar8 + 0x70),*(long *)((long)pvVar8 + 0x78));
      archive_entry_set_size(paVar10,*(int64_t *)((long)pvVar8 + 0x28));
      archive_entry_set_mode(paVar10,*(mode_t *)((long)pvVar8 + 0x40));
      paVar14 = local_a0;
      wVar13 = _archive_entry_copy_pathname_l(paVar10,(char *)psVar15,uVar33,local_a0);
      if (wVar13 == L'\0') {
        iVar12 = 0;
      }
      else {
        piVar22 = __errno_location();
        if (*piVar22 == 0xc) {
          pcVar26 = "Can\'t allocate memory for Pathname";
          iVar12 = 0xc;
LAB_001598c8:
          archive_set_error(&a->archive,iVar12,pcVar26);
          return -0x1e;
        }
        iVar12 = -0x14;
        pcVar26 = archive_string_conversion_charset_name(paVar14);
        archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale."
                          ,pcVar26);
      }
      paVar10 = local_88;
      iVar36 = iVar12;
      if ((*(uint *)((long)pvVar8 + 0x40) & 0xf000) != 0xa000) goto LAB_001599c1;
      *(undefined8 *)((long)pvVar8 + 0xa8) = 0;
      iVar36 = 0;
      archive_entry_set_size(local_88,0);
      pvVar40 = a->format->data;
      pcVar26 = (char *)rar_read_ahead(a,*(size_t *)((long)pvVar40 + 0x20),(ssize_t *)0x0);
      paVar14 = local_78;
      if (pcVar26 == (char *)0x0) {
        return -0x1e;
      }
      local_90 = pvVar40;
      wVar13 = _archive_entry_copy_symlink_l
                         (paVar10,pcVar26,*(size_t *)((long)pvVar40 + 0x20),local_78);
      if (wVar13 != L'\0') {
        piVar22 = __errno_location();
        if (*piVar22 == 0xc) {
          pcVar26 = "Can\'t allocate memory for link";
          goto LAB_001592fb;
        }
        pcVar26 = archive_string_conversion_charset_name(paVar14);
        archive_set_error(&a->archive,0x54,"link cannot be converted from %s to current locale.",
                          pcVar26);
        iVar36 = -0x14;
      }
      __archive_read_consume(a,*(int64_t *)((long)local_90 + 0x20));
      if (iVar12 < iVar36) {
        iVar36 = iVar12;
      }
LAB_001599c1:
      if (*(long *)((long)pvVar8 + 0xa8) == 0) {
        *(undefined1 *)((long)pvVar8 + 0xed) = 1;
        return iVar36;
      }
      return iVar36;
    }
  }
  else {
    __archive_read_consume(a,uVar30 - 7);
    uVar29 = *(int *)((long)pvVar8 + 0x108) + 1;
    *(uint *)((long)pvVar8 + 0x108) = uVar29;
    if (uVar29 < *(uint *)((long)pvVar8 + 0x10c)) {
      pvVar40 = *(void **)((long)pvVar8 + 0x100);
      uVar33 = (ulong)uVar29;
      if (-1 < *(long *)((long)pvVar40 + uVar33 * 0x18 + 8)) {
        return 0;
      }
LAB_00159884:
      lVar24 = a->filter->position;
      *(long *)((long)pvVar40 + uVar33 * 0x18 + 8) = lVar24;
      *(long *)((long)pvVar40 + uVar33 * 0x18 + 0x10) = lVar24 + *(long *)((long)pvVar8 + 0x20);
      return 0;
    }
    uVar29 = *(uint *)((long)pvVar8 + 0x10c) + 1;
    *(uint *)((long)pvVar8 + 0x10c) = uVar29;
    pvVar40 = realloc(*(void **)((long)pvVar8 + 0x100),(ulong)uVar29 * 0x18);
    *(void **)((long)pvVar8 + 0x100) = pvVar40;
    if (pvVar40 != (void *)0x0) {
      uVar33 = (ulong)*(uint *)((long)pvVar8 + 0x108);
      *(ulong *)((long)pvVar40 + uVar33 * 0x18) = uVar30;
      puVar1 = (undefined4 *)((long)pvVar40 + uVar33 * 0x18 + 8);
      *puVar1 = 0xffffffff;
      puVar1[1] = 0xffffffff;
      puVar1[2] = 0xffffffff;
      puVar1[3] = 0xffffffff;
      goto LAB_00159884;
    }
  }
  pcVar26 = "Couldn\'t allocate memory.";
  iVar12 = 0xc;
  goto LAB_00158ff8;
switchD_00159222_caseD_3:
  bVar3 = *(byte *)((long)pvVar40 + uVar31);
  if ((char)bVar3 < '\0') {
    uVar11 = uVar11 + 2;
    cVar34 = *(char *)((long)pvVar40 + uVar31 + 1);
    uVar35 = uVar2;
  }
  else {
    cVar34 = '\0';
    uVar11 = (uint)(uVar31 + 1);
    uVar35 = 0;
  }
  lVar24 = 0;
  for (; ((byte)((bVar3 & 0x7f) + 2) != (char)lVar24 && (uVar39 < uVar29)); uVar39 = uVar39 + 2) {
    *(undefined1 *)(local_98 + uVar33 + -1 + lVar24 * 2) = uVar35;
    *(char *)(local_98 + uVar33 + lVar24 * 2) =
         *(char *)((long)pvVar40 + (ulong)((int)(uVar33 >> 1) + (int)lVar24 & 0x7fffffff)) + cVar34;
    lVar24 = lVar24 + 1;
  }
  goto LAB_001591df;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct mtree *mtree;
	char *p;
	int r, use_next;

	mtree = (struct mtree *)(a->format->data);

	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}

	if (mtree->entries == NULL) {
		mtree->resolver = archive_entry_linkresolver_new();
		if (mtree->resolver == NULL)
			return ARCHIVE_FATAL;
		archive_entry_linkresolver_set_strategy(mtree->resolver,
		    ARCHIVE_FORMAT_MTREE);
		r = read_mtree(a, mtree);
		if (r != ARCHIVE_OK)
			return (r);
	}

	a->archive.archive_format = mtree->archive_format;
	a->archive.archive_format_name = mtree->archive_format_name;

	for (;;) {
		if (mtree->this_entry == NULL)
			return (ARCHIVE_EOF);
		if (strcmp(mtree->this_entry->name, "..") == 0) {
			mtree->this_entry->used = 1;
			if (archive_strlen(&mtree->current_dir) > 0) {
				/* Roll back current path. */
				p = mtree->current_dir.s
				    + mtree->current_dir.length - 1;
				while (p >= mtree->current_dir.s && *p != '/')
					--p;
				if (p >= mtree->current_dir.s)
					--p;
				mtree->current_dir.length
				    = p - mtree->current_dir.s + 1;
			}
		}
		if (!mtree->this_entry->used) {
			use_next = 0;
			r = parse_file(a, entry, mtree, mtree->this_entry,
				&use_next);
			if (use_next == 0)
				return (r);
		}
		mtree->this_entry = mtree->this_entry->next;
	}
}